

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O3

ZSTD_frameSizeInfo *
duckdb_zstd::ZSTD_findFrameSizeInfo
          (ZSTD_frameSizeInfo *__return_storage_ptr__,void *src,size_t srcSize,ZSTD_format_e format)

{
  ZSTD_frameSizeInfo *pZVar1;
  ZSTD_frameSizeInfo *pZVar2;
  size_t sVar3;
  undefined1 *src_00;
  bool bVar4;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  blockProperties_t local_6c;
  ZSTD_frameHeader local_60;
  
  if ((7 < srcSize && format == ZSTD_f_zstd1) && ((*src & 0xfffffff0) == 0x184d2a50)) {
    pZVar1 = (ZSTD_frameSizeInfo *)((ulong)*(uint *)((long)src + 4) + 8);
    pZVar2 = (ZSTD_frameSizeInfo *)0xffffffffffffffb8;
    if (pZVar1 <= srcSize) {
      pZVar2 = pZVar1;
    }
    local_60.frameContentSize = (unsigned_long_long)(ZSTD_frameSizeInfo *)0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      local_60.frameContentSize = (unsigned_long_long)pZVar2;
    }
    pZVar2 = (ZSTD_frameSizeInfo *)0x0;
    __return_storage_ptr__->nbBlocks = 0;
    __return_storage_ptr__->compressedSize = local_60.frameContentSize;
LAB_0127e069:
    __return_storage_ptr__->decompressedBound = (unsigned_long_long)pZVar2;
    return (ZSTD_frameSizeInfo *)local_60.frameContentSize;
  }
  pZVar2 = (ZSTD_frameSizeInfo *)ZSTD_getFrameHeader_advanced(&local_60,src,srcSize,format);
  if (pZVar2 < (ZSTD_frameSizeInfo *)0xffffffffffffff89) {
    if (pZVar2 != (ZSTD_frameSizeInfo *)0x0) {
LAB_0127e08d:
      __return_storage_ptr__->compressedSize = 0xffffffffffffffb8;
      goto LAB_0127e0f9;
    }
    src_00 = (undefined1 *)((long)src + (ulong)local_60.headerSize);
    pZVar1 = (ZSTD_frameSizeInfo *)(srcSize - local_60.headerSize);
    pZVar2 = (ZSTD_frameSizeInfo *)ZSTD_getcBlockSize(src_00,(size_t)pZVar1,&local_6c);
    if (pZVar2 < (ZSTD_frameSizeInfo *)0xffffffffffffff89) {
      sVar3 = 1;
      do {
        pZVar2 = (ZSTD_frameSizeInfo *)((long)&pZVar2->nbBlocks + 3);
        bVar4 = pZVar1 < pZVar2;
        pZVar1 = (ZSTD_frameSizeInfo *)((long)pZVar1 - (long)pZVar2);
        if (bVar4) {
          pZVar2 = (ZSTD_frameSizeInfo *)0xffffffffffffffb8;
          break;
        }
        src_00 = src_00 + (long)pZVar2;
        if (local_6c.lastBlock != 0) {
          if (local_60.checksumFlag != 0) {
            if (pZVar1 < (ZSTD_frameSizeInfo *)0x4) goto LAB_0127e08d;
            src_00 = src_00 + 4;
          }
          pZVar2 = (ZSTD_frameSizeInfo *)(local_60.blockSizeMax * sVar3);
          if ((ZSTD_frameSizeInfo *)local_60.frameContentSize !=
              (ZSTD_frameSizeInfo *)0xffffffffffffffff) {
            pZVar2 = (ZSTD_frameSizeInfo *)local_60.frameContentSize;
          }
          __return_storage_ptr__->nbBlocks = sVar3;
          __return_storage_ptr__->compressedSize = (long)src_00 - (long)src;
          goto LAB_0127e069;
        }
        pZVar2 = (ZSTD_frameSizeInfo *)ZSTD_getcBlockSize(src_00,(size_t)pZVar1,&local_6c);
        sVar3 = sVar3 + 1;
      } while (pZVar2 < (ZSTD_frameSizeInfo *)0xffffffffffffff89);
    }
  }
  __return_storage_ptr__->compressedSize = (size_t)pZVar2;
LAB_0127e0f9:
  __return_storage_ptr__->decompressedBound = 0xfffffffffffffffe;
  return pZVar2;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize, ZSTD_format_e format)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    ZSTD_memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (format == ZSTD_f_zstd1 && ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if (format == ZSTD_f_zstd1 && (srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader_advanced(&zfh, src, srcSize, format);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.nbBlocks = nbBlocks;
        frameSizeInfo.compressedSize = (size_t)(ip - ipstart);
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : (unsigned long long)nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}